

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O3

void btTransformUtil::integrateTransform
               (btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,btScalar timeStep,
               btTransform *predictedTransform)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btQuaternion q;
  float local_58;
  float local_48;
  float fStack_44;
  btQuaternion local_28;
  
  uVar1 = *(undefined8 *)(curTrans->m_origin).m_floats;
  auVar2._4_4_ = (float)((ulong)uVar1 >> 0x20) +
                 timeStep * (float)((ulong)*(undefined8 *)linvel->m_floats >> 0x20);
  auVar2._0_4_ = (float)uVar1 + timeStep * (float)*(undefined8 *)linvel->m_floats;
  auVar2._8_4_ = linvel->m_floats[2] * timeStep + (curTrans->m_origin).m_floats[2];
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(predictedTransform->m_origin).m_floats = auVar2;
  local_58 = angvel->m_floats[0];
  local_48 = (float)*(undefined8 *)(angvel->m_floats + 1);
  fStack_44 = (float)((ulong)*(undefined8 *)(angvel->m_floats + 1) >> 0x20);
  fVar4 = SQRT(fStack_44 * fStack_44 + local_58 * local_58 + local_48 * local_48);
  uVar3 = -(uint)(0.7853982 < fVar4 * timeStep);
  fVar4 = (float)(~uVar3 & (uint)fVar4 | (uint)(0.7853982 / timeStep) & uVar3);
  if (0.001 <= fVar4) {
    fStack_44 = sinf(fVar4 * 0.5 * timeStep);
    fStack_44 = fStack_44 / fVar4;
    local_58 = angvel->m_floats[0] * fStack_44;
    local_48 = fStack_44 * (float)*(undefined8 *)(angvel->m_floats + 1);
    fStack_44 = fStack_44 * (float)((ulong)*(undefined8 *)(angvel->m_floats + 1) >> 0x20);
  }
  else {
    fVar7 = timeStep * 0.5 + timeStep * timeStep * timeStep * -0.020833334 * fVar4 * fVar4;
    local_58 = local_58 * fVar7;
    local_48 = local_48 * fVar7;
    fStack_44 = fStack_44 * fVar7;
  }
  fVar4 = cosf(timeStep * fVar4 * 0.5);
  btMatrix3x3::getRotation(&curTrans->m_basis,&local_28);
  fVar7 = local_28.super_btQuadWord.m_floats[1] * -fStack_44 +
          local_28.super_btQuadWord.m_floats[2] * local_48 +
          fVar4 * local_28.super_btQuadWord.m_floats[0] +
          local_58 * local_28.super_btQuadWord.m_floats[3];
  fVar5 = local_28.super_btQuadWord.m_floats[2] * -local_58 +
          local_28.super_btQuadWord.m_floats[0] * fStack_44 +
          fVar4 * local_28.super_btQuadWord.m_floats[1] +
          local_48 * local_28.super_btQuadWord.m_floats[3];
  fVar6 = local_28.super_btQuadWord.m_floats[0] * -local_48 +
          local_28.super_btQuadWord.m_floats[1] * local_58 +
          fVar4 * local_28.super_btQuadWord.m_floats[2] +
          fStack_44 * local_28.super_btQuadWord.m_floats[3];
  fVar4 = local_28.super_btQuadWord.m_floats[2] * -fStack_44 +
          local_28.super_btQuadWord.m_floats[1] * -local_48 +
          fVar4 * local_28.super_btQuadWord.m_floats[3] +
          -local_58 * local_28.super_btQuadWord.m_floats[0];
  local_28.super_btQuadWord.m_floats[3] =
       1.0 / SQRT(fVar4 * fVar4 + fVar6 * fVar6 + fVar7 * fVar7 + fVar5 * fVar5);
  local_28.super_btQuadWord.m_floats[0] = local_28.super_btQuadWord.m_floats[3] * fVar7;
  local_28.super_btQuadWord.m_floats[1] = local_28.super_btQuadWord.m_floats[3] * fVar5;
  local_28.super_btQuadWord.m_floats[2] = local_28.super_btQuadWord.m_floats[3] * fVar6;
  local_28.super_btQuadWord.m_floats[3] = local_28.super_btQuadWord.m_floats[3] * fVar4;
  btMatrix3x3::setRotation(&predictedTransform->m_basis,&local_28);
  return;
}

Assistant:

static void integrateTransform(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep,btTransform& predictedTransform)
	{
		predictedTransform.setOrigin(curTrans.getOrigin() + linvel * timeStep);
//	#define QUATERNION_DERIVATIVE
	#ifdef QUATERNION_DERIVATIVE
		btQuaternion predictedOrn = curTrans.getRotation();
		predictedOrn += (angvel * predictedOrn) * (timeStep * btScalar(0.5));
		predictedOrn.normalize();
	#else
		//Exponential map
		//google for "Practical Parameterization of Rotations Using the Exponential Map", F. Sebastian Grassia

		btVector3 axis;
		btScalar	fAngle = angvel.length(); 
		//limit the angular motion
		if (fAngle*timeStep > ANGULAR_MOTION_THRESHOLD)
		{
			fAngle = ANGULAR_MOTION_THRESHOLD / timeStep;
		}

		if ( fAngle < btScalar(0.001) )
		{
			// use Taylor's expansions of sync function
			axis   = angvel*( btScalar(0.5)*timeStep-(timeStep*timeStep*timeStep)*(btScalar(0.020833333333))*fAngle*fAngle );
		}
		else
		{
			// sync(fAngle) = sin(c*fAngle)/t
			axis   = angvel*( btSin(btScalar(0.5)*fAngle*timeStep)/fAngle );
		}
		btQuaternion dorn (axis.x(),axis.y(),axis.z(),btCos( fAngle*timeStep*btScalar(0.5) ));
		btQuaternion orn0 = curTrans.getRotation();

		btQuaternion predictedOrn = dorn * orn0;
		predictedOrn.normalize();
	#endif
		predictedTransform.setRotation(predictedOrn);
	}